

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall CLI::Option::get_type_name_abi_cxx11_(Option *this)

{
  bool bVar1;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *in_RSI;
  Validator *in_RDI;
  string vtype;
  Validator *Validator;
  const_iterator __end2;
  const_iterator __begin2;
  vector<CLI::Validator,_std::allocator<CLI::Validator>_> *__range2;
  string *full_type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  Validator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  __normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
  local_28;
  pointer *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::operator()(&in_RDI->desc_function_);
  bVar1 = std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::empty(in_RSI);
  if (!bVar1) {
    local_20 = &in_RSI[0xf].super__Vector_base<CLI::Validator,_std::allocator<CLI::Validator>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_28._M_current =
         (Validator *)
         std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::begin
                   ((vector<CLI::Validator,_std::allocator<CLI::Validator>_> *)
                    in_stack_ffffffffffffff58);
    std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>::end
              ((vector<CLI::Validator,_std::allocator<CLI::Validator>_> *)in_stack_ffffffffffffff58)
    ;
    while (bVar1 = __gnu_cxx::
                   operator==<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                             ((__normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                               *)in_RDI,
                              (__normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
                               *)in_stack_ffffffffffffff58), ((bVar1 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::
      __normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
      ::operator*(&local_28);
      CLI::Validator::get_description_abi_cxx11_(this_00);
      bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1b5122);
      if (!bVar1) {
        ::std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                   in_stack_ffffffffffffff58);
        ::std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      }
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
      __gnu_cxx::
      __normal_iterator<const_CLI::Validator_*,_std::vector<CLI::Validator,_std::allocator<CLI::Validator>_>_>
      ::operator++(&local_28);
    }
  }
  return (string *)this_00;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE std::string Option::get_type_name() const {
    std::string full_type_name = type_name_();
    if(!validators_.empty()) {
        for(const auto &Validator : validators_) {
            std::string vtype = Validator.get_description();
            if(!vtype.empty()) {
                full_type_name += ":" + vtype;
            }
        }
    }
    return full_type_name;
}